

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expected-main.t.hpp
# Opt level: O1

ostream * lest::operator<<(ostream *os,expected<int,_char> *v)

{
  ostream *poVar1;
  string local_38;
  anon_union_4_2_293c120a_for_storage_t_impl<int,_char>_2 local_14;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"[expected:",10);
  if ((v->contained).super_storage_t_impl<int,_char>.m_has_value == true) {
    local_14 = (v->contained).super_storage_t_impl<int,_char>.field_0;
    make_value_string<int>(&local_38,&local_14.m_value);
  }
  else {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"[empty]","");
  }
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,local_38._M_dataplus._M_p,local_38._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return poVar1;
}

Assistant:

inline std::ostream & operator<<( std::ostream & os, nonstd::expected<T,E> const & v )
{
    using lest::to_string;
    return os << "[expected:" << (v ? to_string(*v) : "[empty]") << "]";
}